

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O3

void __thiscall QFile::QFile(QFile *this,QString *name)

{
  QFileDevicePrivate *this_00;
  
  this_00 = (QFileDevicePrivate *)operator_new(0x1c0);
  QFileDevicePrivate::QFileDevicePrivate(this_00);
  (this_00->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QFilePrivate_006964f0;
  this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)0x0;
  this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.q_ptr = (QObject *)0x0;
  this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.parent = (QObject *)0x0;
  QFileDevice::QFileDevice(&this->super_QFileDevice,this_00,(QObject *)0x0);
  (this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&PTR_metaObject_00696540;
  QString::operator=((QString *)
                     &(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d[5].children,
                     name);
  return;
}

Assistant:

QFile::QFile(const QString &name)
    : QFileDevice(*new QFilePrivate, nullptr)
{
    Q_D(QFile);
    d->fileName = name;
}